

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint64_t helper_fcmpne16(uint64_t src1,uint64_t src2)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 local_28;
  VIS64 d;
  VIS64 s;
  uint64_t src2_local;
  uint64_t src1_local;
  
  d.w[0] = (uint16_t)src1;
  local_28._0_2_ = (uint16_t)src2;
  d.w[1] = (uint16_t)(src1 >> 0x10);
  local_28._2_2_ = (uint16_t)(src2 >> 0x10);
  uVar1 = 0;
  if (d.w[1] != local_28._2_2_) {
    uVar1 = 2;
  }
  d.w[2] = (uint16_t)(src1 >> 0x20);
  local_28._4_2_ = (uint16_t)(src2 >> 0x20);
  uVar2 = 0;
  if (d.w[2] != local_28._4_2_) {
    uVar2 = 4;
  }
  d.w[3] = (uint16_t)(src1 >> 0x30);
  local_28._6_2_ = (uint16_t)(src2 >> 0x30);
  uVar3 = 0;
  if (d.w[3] != local_28._6_2_) {
    uVar3 = 8;
  }
  local_28 = (ulong)(ushort)(d.w[0] != (uint16_t)local_28 | uVar1 | uVar2 | uVar3);
  return local_28;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}